

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

bool __thiscall OpenMD::RigidBody::getAtomPos(RigidBody *this,Vector3d *pos,Atom *atom)

{
  double *pdVar1;
  Atom **ppAVar2;
  uint i;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  _Var3;
  long lVar4;
  long lVar5;
  Vector<double,_3U> result;
  Vector3d ref;
  Atom *local_80;
  double local_78 [4];
  double local_58 [4];
  Vector3d local_38;
  
  local_80 = atom;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Atom*const>>
                    ((this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_80);
  ppAVar2 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current == ppAVar2) {
    snprintf(painCave.errMsg,2000,"Atom %d does not belong to rigid body %d.\n",
             (ulong)(uint)(local_80->super_StuntDouble).globalIndex_,
             (ulong)(uint)(this->super_StuntDouble).globalIndex_);
    painCave.isFatal = 0;
    simError();
  }
  else {
    StuntDouble::body2Lab
              (&local_38,&this->super_StuntDouble,
               (this->refCoords_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               ((ulong)((long)_Var3._M_current -
                       (long)(this->atoms_).
                             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3));
    lVar5 = (long)(this->super_StuntDouble).localIndex_;
    lVar4 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                             position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (this->super_StuntDouble).storage_);
    local_58[2] = (double)*(undefined8 *)(lVar4 + 0x10 + lVar5 * 0x18);
    pdVar1 = (double *)(lVar4 + lVar5 * 0x18);
    local_58[0] = *pdVar1;
    local_58[1] = pdVar1[1];
    local_78[0] = 0.0;
    local_78[1] = 0.0;
    local_78[2] = 0.0;
    lVar4 = 0;
    do {
      local_78[lVar4] = local_58[lVar4] + local_38.super_Vector<double,_3U>.data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    (pos->super_Vector<double,_3U>).data_[2] = local_78[2];
    (pos->super_Vector<double,_3U>).data_[0] = local_78[0];
    (pos->super_Vector<double,_3U>).data_[1] = local_78[1];
  }
  return _Var3._M_current != ppAVar2;
}

Assistant:

bool RigidBody::getAtomPos(Vector3d& pos, Atom* atom) {
    std::vector<Atom*>::iterator i;
    i = std::find(atoms_.begin(), atoms_.end(), atom);
    if (i != atoms_.end()) {
      // RigidBody class makes sure refCoords_ and atoms_ match each other
      Vector3d ref = body2Lab(refCoords_[i - atoms_.begin()]);
      pos          = getPos() + ref;
      return true;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Atom %d does not belong to rigid body %d.\n",
               atom->getGlobalIndex(), getGlobalIndex());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }